

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int c1fgkb_(int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *in1,double *ch,
           double *ch1,int *in2,double *wa)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  bool bVar47;
  double *local_128;
  int local_d0;
  
  iVar5 = *ido;
  lVar31 = (long)iVar5;
  iVar29 = *ip;
  lVar38 = (long)iVar29;
  uVar28 = ~(iVar29 * iVar5);
  iVar10 = *in1;
  lVar39 = (long)iVar10;
  uVar6 = *lid;
  lVar40 = (long)(int)uVar6;
  lVar46 = (long)(int)~((uVar6 + 1) * iVar10);
  uVar7 = *l1;
  lVar30 = (long)(int)uVar7;
  lVar21 = (long)(int)(~(uVar7 * (iVar29 + 1)) * iVar10 + -1);
  iVar10 = *in2;
  lVar37 = (long)iVar10;
  lVar26 = (long)(int)~((uVar6 + 1) * iVar10);
  lVar17 = (long)(int)(~((iVar5 + 1) * uVar7) * iVar10 + -1);
  uVar8 = 0;
  if (0 < (int)uVar6) {
    uVar8 = uVar6;
  }
  uVar32 = (ulong)uVar8;
  lVar41 = (lVar40 + 1) * lVar37;
  lVar18 = (lVar40 + 1) * lVar39;
  pdVar15 = ch1 + lVar41 + lVar26 + 2;
  pdVar13 = cc1 + lVar18 + lVar46 + 2;
  lVar1 = lVar39 * 8;
  uVar33 = uVar32;
  while (bVar47 = uVar33 != 0, uVar33 = uVar33 - 1, bVar47) {
    pdVar15[-1] = pdVar13[-1];
    *pdVar15 = *pdVar13;
    pdVar15 = pdVar15 + lVar37;
    pdVar13 = pdVar13 + lVar39;
  }
  lVar22 = lVar38 + -1;
  iVar10 = (iVar29 + 1) / 2;
  lVar43 = (long)iVar10;
  lVar11 = lVar40 * 2 + 1;
  lVar34 = lVar11 * lVar37;
  pdVar27 = ch1 + lVar34 + 2;
  lVar45 = lVar40 * lVar37;
  lVar11 = lVar11 * lVar39;
  pdVar15 = cc1 + lVar11 + lVar46;
  lVar35 = lVar40 * lVar39;
  lVar12 = ((long)(iVar29 + 2) + -2) * lVar40 + 1;
  lVar24 = lVar12 * lVar37;
  pdVar16 = ch1 + lVar24 + 2;
  lVar12 = lVar12 * lVar39;
  pdVar13 = cc1 + lVar12 + lVar46;
  for (lVar25 = 2; lVar25 <= lVar43; lVar25 = lVar25 + 1) {
    lVar44 = 0x10;
    uVar33 = uVar32;
    pdVar14 = pdVar16;
    pdVar23 = pdVar27;
    while (bVar47 = uVar33 != 0, uVar33 = uVar33 - 1, bVar47) {
      pdVar23[lVar26 + -1] =
           *(double *)((long)pdVar15 + lVar44 + -8) + *(double *)((long)pdVar13 + lVar44 + -8);
      pdVar14[lVar26 + -1] =
           *(double *)((long)pdVar15 + lVar44 + -8) - *(double *)((long)pdVar13 + lVar44 + -8);
      pdVar23[lVar26] = *(double *)((long)pdVar15 + lVar44) + *(double *)((long)pdVar13 + lVar44);
      pdVar14[lVar26] = *(double *)((long)pdVar15 + lVar44) - *(double *)((long)pdVar13 + lVar44);
      pdVar23 = pdVar23 + lVar37;
      lVar44 = lVar44 + lVar1;
      pdVar14 = pdVar14 + lVar37;
    }
    pdVar27 = pdVar27 + lVar45;
    pdVar15 = pdVar15 + lVar35;
    pdVar16 = pdVar16 + -lVar45;
    pdVar13 = pdVar13 + -lVar35;
  }
  pdVar15 = ch1 + lVar34 + lVar26 + 2;
  for (lVar25 = 2; pdVar13 = cc1 + lVar18 + lVar46 + 2, pdVar16 = pdVar15, uVar33 = uVar32,
      lVar25 <= lVar43; lVar25 = lVar25 + 1) {
    while (bVar47 = uVar33 != 0, uVar33 = uVar33 - 1, bVar47) {
      pdVar13[-1] = pdVar16[-1] + pdVar13[-1];
      *pdVar13 = *pdVar16 + *pdVar13;
      pdVar16 = pdVar16 + lVar37;
      pdVar13 = pdVar13 + lVar39;
    }
    pdVar15 = pdVar15 + lVar45;
  }
  iVar9 = (int)lVar22 * 2;
  pdVar15 = cc1 + lVar11 + lVar46;
  pdVar13 = cc1 + lVar12 + lVar46;
  for (lVar25 = 2; lVar25 <= lVar43; lVar25 = lVar25 + 1) {
    local_d0 = (int)lVar25 + -1;
    lVar44 = (lVar22 + lVar25 + -1) * lVar31;
    lVar19 = (iVar9 + lVar25 + -1) * lVar31;
    lVar36 = 0x10;
    pdVar16 = ch1 + ((long)(int)(iVar29 * uVar6) + 1) * lVar37 + 2;
    pdVar27 = ch1 + lVar41 + 2;
    uVar33 = uVar32;
    pdVar14 = ch1 + ((long)(int)(uVar6 * 2) + 1) * lVar37 + 2;
    while (bVar47 = uVar33 != 0, uVar33 = uVar33 - 1, bVar47) {
      *(double *)((long)pdVar15 + lVar36 + -8) =
           wa[(long)(int)uVar28 + lVar44 + 1] * pdVar14[lVar26 + -1] + pdVar27[lVar26 + -1];
      *(double *)((long)pdVar13 + lVar36 + -8) =
           wa[(long)(int)uVar28 + lVar19 + 1] * pdVar16[lVar26 + -1];
      *(double *)((long)pdVar15 + lVar36) =
           wa[(long)(int)uVar28 + lVar44 + 1] * pdVar14[lVar26] + pdVar27[lVar26];
      *(double *)((long)pdVar13 + lVar36) = wa[(long)(int)uVar28 + lVar19 + 1] * pdVar16[lVar26];
      pdVar27 = pdVar27 + lVar37;
      pdVar14 = pdVar14 + lVar37;
      lVar36 = lVar36 + lVar1;
      pdVar16 = pdVar16 + lVar37;
    }
    pdVar16 = ch1 + (((long)(iVar29 + 2) + -3) * lVar40 + 1) * lVar37 + 2;
    pdVar27 = ch1 + (lVar40 * 3 + 1) * lVar37 + 2;
    for (uVar33 = 3; uVar33 != iVar10 + 1; uVar33 = uVar33 + 1) {
      iVar20 = (((int)uVar33 + -1) * local_d0) % iVar29;
      dVar2 = wa[(long)(int)uVar28 + (long)(((int)lVar22 + iVar20) * iVar5) + 1];
      dVar3 = wa[(long)(int)uVar28 + (long)((iVar20 + iVar9) * iVar5) + 1];
      lVar44 = 0x10;
      pdVar14 = pdVar16;
      pdVar23 = pdVar27;
      uVar42 = uVar32;
      while (bVar47 = uVar42 != 0, uVar42 = uVar42 - 1, bVar47) {
        *(double *)((long)pdVar15 + lVar44 + -8) =
             pdVar23[lVar26 + -1] * dVar2 + *(double *)((long)pdVar15 + lVar44 + -8);
        *(double *)((long)pdVar13 + lVar44 + -8) =
             pdVar14[lVar26 + -1] * dVar3 + *(double *)((long)pdVar13 + lVar44 + -8);
        *(double *)((long)pdVar15 + lVar44) =
             pdVar23[lVar26] * dVar2 + *(double *)((long)pdVar15 + lVar44);
        *(double *)((long)pdVar13 + lVar44) =
             pdVar14[lVar26] * dVar3 + *(double *)((long)pdVar13 + lVar44);
        pdVar23 = pdVar23 + lVar37;
        lVar44 = lVar44 + lVar1;
        pdVar14 = pdVar14 + lVar37;
      }
      pdVar27 = pdVar27 + lVar45;
      pdVar16 = pdVar16 + -lVar45;
    }
    pdVar15 = pdVar15 + lVar35;
    pdVar13 = pdVar13 + -lVar35;
  }
  if ((iVar5 < 2) && (*na != 1)) {
    pdVar15 = cc1 + lVar11 + lVar46 + 2;
    pdVar13 = cc1 + lVar12 + lVar46 + 2;
    for (lVar17 = 2; lVar17 <= lVar43; lVar17 = lVar17 + 1) {
      lVar21 = 0;
      uVar33 = uVar32;
      while (bVar47 = uVar33 != 0, uVar33 = uVar33 - 1, bVar47) {
        dVar2 = *(double *)((long)pdVar13 + lVar21);
        dVar3 = *(double *)((long)pdVar15 + lVar21 + -8);
        *(double *)((long)pdVar15 + lVar21 + -8) = dVar3 - dVar2;
        dVar4 = *(double *)((long)pdVar13 + lVar21 + -8);
        *(double *)((long)pdVar13 + lVar21) = *(double *)((long)pdVar15 + lVar21) - dVar4;
        *(double *)((long)pdVar15 + lVar21) = dVar4 + *(double *)((long)pdVar15 + lVar21);
        *(double *)((long)pdVar13 + lVar21 + -8) = dVar3 + dVar2;
        lVar21 = lVar21 + lVar1;
      }
      pdVar15 = pdVar15 + lVar35;
      pdVar13 = pdVar13 + -lVar35;
    }
  }
  else {
    pdVar15 = ch1 + lVar41 + lVar26 + 2;
    pdVar13 = cc1 + lVar18 + lVar46 + 2;
    uVar33 = uVar32;
    while (bVar47 = uVar33 != 0, uVar33 = uVar33 - 1, bVar47) {
      pdVar15[-1] = pdVar13[-1];
      *pdVar15 = *pdVar13;
      pdVar15 = pdVar15 + lVar37;
      pdVar13 = pdVar13 + lVar39;
    }
    pdVar15 = ch1 + lVar34 + 2;
    pdVar16 = cc1 + lVar11 + lVar46;
    pdVar13 = ch1 + lVar24 + 2;
    pdVar27 = cc1 + lVar12 + lVar46;
    for (lVar40 = 2; lVar40 <= lVar43; lVar40 = lVar40 + 1) {
      lVar46 = 0x10;
      pdVar14 = pdVar15;
      pdVar23 = pdVar13;
      uVar33 = uVar32;
      while (bVar47 = uVar33 != 0, uVar33 = uVar33 - 1, bVar47) {
        pdVar14[lVar26 + -1] =
             *(double *)((long)pdVar16 + lVar46 + -8) - *(double *)((long)pdVar27 + lVar46);
        pdVar23[lVar26 + -1] =
             *(double *)((long)pdVar16 + lVar46 + -8) + *(double *)((long)pdVar27 + lVar46);
        pdVar23[lVar26] =
             *(double *)((long)pdVar16 + lVar46) - *(double *)((long)pdVar27 + lVar46 + -8);
        pdVar14[lVar26] =
             *(double *)((long)pdVar16 + lVar46) + *(double *)((long)pdVar27 + lVar46 + -8);
        pdVar14 = pdVar14 + lVar37;
        lVar46 = lVar46 + lVar1;
        pdVar23 = pdVar23 + lVar37;
      }
      pdVar15 = pdVar15 + lVar45;
      pdVar16 = pdVar16 + lVar35;
      pdVar13 = pdVar13 + -lVar45;
      pdVar27 = pdVar27 + -lVar35;
    }
    if (iVar5 != 1) {
      uVar33 = 0;
      if (0 < (int)uVar7) {
        uVar33 = (ulong)uVar7;
      }
      iVar29 = 0;
      if (0 < iVar5) {
        iVar29 = iVar5;
      }
      pdVar13 = ch + ((lVar31 + 1) * lVar30 + 1) * lVar37 + lVar17 + 2;
      lVar26 = lVar30 * lVar37;
      pdVar15 = cc + lVar21 + ((lVar38 + 1) * lVar30 + 1) * lVar39 + 2;
      for (uVar32 = 1; pdVar16 = pdVar15, pdVar27 = pdVar13, uVar42 = uVar33, uVar32 != iVar29 + 1;
          uVar32 = uVar32 + 1) {
        while (uVar42 != 0) {
          pdVar16[-1] = pdVar27[-1];
          *pdVar16 = *pdVar27;
          pdVar16 = pdVar16 + lVar39;
          pdVar27 = pdVar27 + lVar37;
          uVar42 = uVar42 - 1;
        }
        pdVar13 = pdVar13 + lVar26;
        pdVar15 = pdVar15 + lVar38 * lVar30 * lVar39;
      }
      pdVar13 = ch + ((lVar31 * 2 + 1) * lVar30 + 1) * lVar37 + lVar17 + 2;
      pdVar15 = cc + lVar21 + ((lVar38 + 2) * lVar30 + 1) * lVar39 + 2;
      lVar46 = lVar30 * lVar39;
      for (lVar40 = 2; pdVar16 = pdVar15, pdVar27 = pdVar13, uVar32 = uVar33, lVar40 <= lVar38;
          lVar40 = lVar40 + 1) {
        while (bVar47 = uVar32 != 0, uVar32 = uVar32 - 1, bVar47) {
          pdVar16[-1] = pdVar27[-1];
          *pdVar16 = *pdVar27;
          pdVar27 = pdVar27 + lVar37;
          pdVar16 = pdVar16 + lVar39;
        }
        pdVar13 = pdVar13 + lVar31 * lVar30 * lVar37;
        pdVar15 = pdVar15 + lVar46;
      }
      local_128 = ch + ((lVar31 * 2 + 2) * lVar30 + 1) * lVar37 + lVar17 + 2;
      pdVar15 = cc + lVar21 + ((lVar38 * 2 + 2) * lVar30 + 1) * lVar39 + 2;
      for (lVar17 = 2; lVar17 <= lVar38; lVar17 = lVar17 + 1) {
        lVar21 = (lVar22 + lVar17 + -1) * lVar31;
        lVar30 = (iVar9 + lVar17 + -1) * lVar31;
        pdVar13 = pdVar15;
        pdVar16 = local_128;
        for (lVar40 = 2; uVar32 = uVar33, pdVar27 = pdVar16, pdVar14 = pdVar13, lVar40 <= lVar31;
            lVar40 = lVar40 + 1) {
          while (uVar32 != 0) {
            pdVar14[-1] = wa[(long)(int)uVar28 + lVar21 + lVar40] * pdVar27[-1] -
                          *pdVar27 * wa[(long)(int)uVar28 + lVar30 + lVar40];
            *pdVar14 = wa[(long)(int)uVar28 + lVar21 + lVar40] * *pdVar27 +
                       wa[(long)(int)uVar28 + lVar30 + lVar40] * pdVar27[-1];
            uVar32 = uVar32 - 1;
            pdVar27 = pdVar27 + lVar37;
            pdVar14 = pdVar14 + lVar39;
          }
          pdVar16 = pdVar16 + lVar26;
          pdVar13 = pdVar13 + lVar46 * lVar38;
        }
        local_128 = local_128 + lVar26 * lVar31;
        pdVar15 = pdVar15 + lVar46;
      }
    }
  }
  return 0;
}

Assistant:

int c1fgkb_(int *ido, int *ip, int *l1, int *
	lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *in1, fft_real_t *ch, fft_real_t *
	ch1, int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, cc1_dim1, cc1_dim2, cc1_offset, ch1_dim1, ch1_dim2,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3;

    /* Local variables */
     int i__, j, k, l, jc, lc, ki;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim1 = *in1;
    cc1_dim2 = *lid;
    cc1_offset = 1 + cc1_dim1 * (1 + cc1_dim2);
    cc1 -= cc1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch1_dim1 = *in2;
    ch1_dim2 = *lid;
    ch1_offset = 1 + ch1_dim1 * (1 + ch1_dim2);
    ch1 -= ch1_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_dim3 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L110: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
/* L112: */
	}
/* L111: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 1] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 2] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 2];
/* L117: */
	}
/* L118: */
    }
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 1] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 1];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 2] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 2];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 2];
/* L113: */
	}
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__3 = *lid;
	    for (ki = 1; ki <= i__3; ++ki) {
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 2];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 2];
/* L114: */
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    chold1 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] - cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    chold2 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] + cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] = chold1;
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 2] += cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 1];
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1] = chold2;
/* L119: */
	}
/* L120: */
    }
    return 0;
L136:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L137: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
/* L134: */
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 2];
/* L130: */
	}
/* L131: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 2] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 2];
/* L122: */
	}
/* L123: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *ido;
	for (i__ = 2; i__ <= i__2; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 1] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1] - wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 2];
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 2] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 2] + wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L124: */
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}